

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_output_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  LYS_NODE LVar1;
  int iVar2;
  size_t sVar3;
  lyd_node *plVar4;
  LY_ERR *pLVar5;
  lys_node *siblings;
  lys_node **pplVar6;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0)
  goto LAB_0015b787;
  if (parent == (lyd_node *)0x0) {
    pplVar6 = &module->data;
LAB_0015b738:
    siblings = *pplVar6;
    if (siblings == (lys_node *)0x0) goto LAB_0015b787;
  }
  else {
    if ((parent->schema == (lys_node *)0x0) ||
       (siblings = parent->schema->child, siblings == (lys_node *)0x0)) goto LAB_0015b787;
    LVar1 = siblings->nodetype;
    if (LVar1 == LYS_INPUT) {
      siblings = siblings->next;
      if (siblings == (lys_node *)0x0) goto LAB_0015b787;
      LVar1 = siblings->nodetype;
    }
    if (LVar1 == LYS_OUTPUT) {
      pplVar6 = &siblings->child;
      goto LAB_0015b738;
    }
  }
  sVar3 = strlen(name);
  iVar2 = lys_get_data_sibling(module,siblings,name,(int)sVar3,LYS_LEAFLIST|LYS_LEAF,&local_38);
  if (iVar2 == 0 && local_38 != (lys_node *)0x0) {
    plVar4 = _lyd_new_leaf(parent,local_38,val_str,0);
    return plVar4;
  }
LAB_0015b787:
  pLVar5 = ly_errno_location();
  *pLVar5 = LY_EINVAL;
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_output_leaf(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *val_str)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_LEAFLIST | LYS_LEAF, &snode) || !snode) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    return _lyd_new_leaf(parent, snode, val_str, 0);
}